

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O2

void __thiscall
wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::TopologicalOrdersImpl
          (TopologicalOrdersImpl<std::less<unsigned_int>_> *this,Graph_conflict *graph)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
  *this_01;
  Index *pIVar1;
  pointer puVar2;
  pointer pvVar3;
  uint *puVar4;
  pointer puVar5;
  pointer pSVar6;
  long lVar7;
  Index extraout_var;
  const_iterator __begin2;
  pointer pvVar8;
  fd_set *__writefds;
  Index extraout_EDX;
  uint *puVar9;
  Selector *this_02;
  fd_set *__exceptfds;
  timeval *in_R9;
  uint choice;
  Selector local_40;
  
  this->graph = graph;
  this_00 = &this->indegrees;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (this_00,((long)(graph->
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(graph->
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x18,
             (allocator_type *)&local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->buf,
             ((long)(graph->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(graph->
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&local_40);
  (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->selectors).
  super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->selectors).
  super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->selectors).
  super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar8 = (graph->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (graph->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pvVar3 - (long)pvVar8;
  if (pvVar3 != pvVar8) {
    this_01 = &this->selectors;
    for (; pvVar8 != pvVar3; pvVar8 = pvVar8 + 1) {
      puVar4 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar5 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (puVar9 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start; puVar9 != puVar4; puVar9 = puVar9 + 1)
      {
        in_R9 = (timeval *)(ulong)*puVar9;
        puVar2 = puVar5 + (long)in_R9;
        *puVar2 = *puVar2 + 1;
      }
    }
    std::
    vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
    ::reserve(this_01,lVar7 / 0x18);
    local_40.start = 0;
    local_40.count = 0;
    local_40.index = 0;
    std::
    vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector,std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>>
    ::emplace_back<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>
              ((vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector,std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>>
                *)this_01,&local_40);
    pSVar6 = (this->selectors).
             super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    choice = 0;
    while( true ) {
      __exceptfds = (fd_set *)
                    (graph->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      pvVar8 = (graph->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pvVar8 - (long)__exceptfds) / 0x18) <= (ulong)choice) break;
      if ((this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[choice] == 0) {
        pushChoice(this,choice);
        pIVar1 = &pSVar6[-1].count;
        *pIVar1 = *pIVar1 + 1;
      }
      choice = choice + 1;
    }
    while( true ) {
      pSVar6 = (this->selectors).
               super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __writefds = (fd_set *)((long)pvVar8 - (long)__exceptfds);
      this_02 = pSVar6 + -1;
      if ((ulong)((long)__writefds / 0x18) <=
          (ulong)(((long)pSVar6 -
                  (long)(this->selectors).
                        super__Vector_base<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::Selector>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xc)) break;
      local_40.start =
           Selector::select(this_02,(int)this,(fd_set *)((long)__writefds % 0x18),__writefds,
                            __exceptfds,in_R9);
      local_40.count = extraout_var;
      local_40.index = extraout_EDX;
      std::
      vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector,std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>>
      ::emplace_back<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>
                ((vector<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector,std::allocator<wasm::TopologicalOrdersImpl<std::less<unsigned_int>>::Selector>>
                  *)this_01,&local_40);
      __exceptfds = (fd_set *)
                    (graph->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      pvVar8 = (graph->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    Selector::select(this_02,(int)this,(fd_set *)((long)__writefds % 0x18),__writefds,__exceptfds,
                     in_R9);
  }
  return;
}

Assistant:

TopologicalOrdersImpl(const Graph& graph, Cmp cmp)
    : graph(graph), indegrees(graph.size()), buf(graph.size()), cmp(cmp) {
    if (graph.size() == 0) {
      return;
    }
    // Find the in-degree of each vertex.
    for (const auto& vertex : graph) {
      for (auto child : vertex) {
        ++indegrees[child];
      }
    }
    // Set up the first selector with its possible selections.
    selectors.reserve(graph.size());
    selectors.push_back({0, 0, 0});
    auto& first = selectors.back();
    for (Index i = 0; i < graph.size(); ++i) {
      if (indegrees[i] == 0) {
        if constexpr (useMinHeap) {
          pushChoice(i);
        } else {
          buf[first.count] = i;
        }
        ++first.count;
      }
    }
    // Initialize the full stack of selectors.
    while (selectors.size() < graph.size()) {
      selectors.push_back(selectors.back().select(*this));
    }
    selectors.back().select(*this);
  }